

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O0

void flatbuffers::AppendTextWrappedString
               (stringstream *ss,string *text,size_t max_col,size_t start_col)

{
  size_t sVar1;
  ulong uVar2;
  unsigned_long *puVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *paVar4;
  ostream *poVar5;
  undefined1 local_b8 [8];
  string rest_of_description;
  string local_90 [48];
  string local_60 [32];
  unsigned_long local_40;
  size_t length;
  size_t ideal_break_location;
  size_t max_line_length;
  size_t start_col_local;
  size_t max_col_local;
  string *text_local;
  stringstream *ss_local;
  
  ideal_break_location = max_col - start_col;
  max_line_length = start_col;
  start_col_local = max_col;
  max_col_local = (size_t)text;
  text_local = (string *)ss;
  uVar2 = std::__cxx11::string::length();
  if (ideal_break_location < uVar2) {
    length = std::__cxx11::string::rfind((char)max_col_local,0x20);
    puVar3 = std::min<unsigned_long>(&ideal_break_location,&length);
    local_40 = *puVar3;
    paVar4 = &text_local->field_2;
    std::__cxx11::string::substr((ulong)local_60,max_col_local);
    poVar5 = std::operator<<((ostream *)paVar4->_M_local_buf,local_60);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string(local_60);
    sVar1 = max_line_length;
    paVar4 = &text_local->field_2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_90,sVar1,' ',
               (allocator<char> *)(rest_of_description.field_2._M_local_buf + 0xf));
    std::operator<<((ostream *)paVar4->_M_local_buf,local_90);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator
              ((allocator<char> *)(rest_of_description.field_2._M_local_buf + 0xf));
    sVar1 = max_col_local;
    if (ideal_break_location <= length) {
      std::__cxx11::string::at(max_col_local);
    }
    std::__cxx11::string::substr((ulong)local_b8,sVar1);
    AppendTextWrappedString
              ((stringstream *)text_local,(string *)local_b8,start_col_local,max_line_length);
    std::__cxx11::string::~string((string *)local_b8);
  }
  else {
    std::operator<<((ostream *)(text_local->field_2)._M_local_buf,(string *)max_col_local);
  }
  return;
}

Assistant:

static void AppendTextWrappedString(std::stringstream &ss, std::string &text,
                                    size_t max_col, size_t start_col) {
  size_t max_line_length = max_col - start_col;

  if (text.length() > max_line_length) {
    size_t ideal_break_location = text.rfind(' ', max_line_length);
    size_t length = std::min(max_line_length, ideal_break_location);
    ss << text.substr(0, length) << "\n";
    ss << std::string(start_col, ' ');
    std::string rest_of_description = text.substr(
        ((ideal_break_location < max_line_length || text.at(length) == ' ')
             ? length + 1
             : length));
    AppendTextWrappedString(ss, rest_of_description, max_col, start_col);
  } else {
    ss << text;
  }
}